

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

char * jsonnet::internal::Token::toString(Kind v)

{
  ostream *poVar1;
  
  if (v < (END_OF_FILE|BRACE_R)) {
    return &DAT_00215320 + *(int *)(&DAT_00215320 + (ulong)v * 4);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown token kind: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v);
  std::endl<char,std::char_traits<char>>(poVar1);
  abort();
}

Assistant:

static const char *toString(Kind v)
    {
        switch (v) {
            case BRACE_L: return "\"{\"";
            case BRACE_R: return "\"}\"";
            case BRACKET_L: return "\"[\"";
            case BRACKET_R: return "\"]\"";
            case COMMA: return "\",\"";
            case DOLLAR: return "\"$\"";
            case DOT: return "\".\"";

            case PAREN_L: return "\"(\"";
            case PAREN_R: return "\")\"";
            case SEMICOLON: return "\";\"";

            case IDENTIFIER: return "IDENTIFIER";
            case NUMBER: return "NUMBER";
            case OPERATOR: return "OPERATOR";
            case STRING_SINGLE: return "STRING_SINGLE";
            case STRING_DOUBLE: return "STRING_DOUBLE";
            case VERBATIM_STRING_SINGLE: return "VERBATIM_STRING_SINGLE";
            case VERBATIM_STRING_DOUBLE: return "VERBATIM_STRING_DOUBLE";
            case STRING_BLOCK: return "STRING_BLOCK";

            case ASSERT: return "assert";
            case ELSE: return "else";
            case ERROR: return "error";
            case FALSE: return "false";
            case FOR: return "for";
            case FUNCTION: return "function";
            case IF: return "if";
            case IMPORT: return "import";
            case IMPORTSTR: return "importstr";
            case IMPORTBIN: return "importbin";
            case IN: return "in";
            case LOCAL: return "local";
            case NULL_LIT: return "null";
            case SELF: return "self";
            case SUPER: return "super";
            case TAILSTRICT: return "tailstrict";
            case THEN: return "then";
            case TRUE: return "true";

            case END_OF_FILE: return "end of file";
            default:
                std::cerr << "INTERNAL ERROR: Unknown token kind: " << v << std::endl;
                std::abort();
        }
    }